

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON __thiscall JSON::parse(JSON *this,InputSource *is,Reactor *reactor)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  JSONParser jp;
  JSONParser local_40c0;
  
  local_40c0.p = local_40c0.buf;
  local_40c0.lex_state = ls_top;
  local_40c0.bytes = 0;
  local_40c0.token._M_dataplus._M_p = (pointer)&local_40c0.token.field_2;
  local_40c0.u_count = 0;
  local_40c0.u_value._0_1_ = 0;
  local_40c0.u_value._1_7_ = 0;
  local_40c0.offset._0_1_ = 0;
  local_40c0._16441_8_ = 0;
  local_40c0.token._M_string_length = 0;
  local_40c0.token.field_2._M_local_buf[0] = '\0';
  local_40c0.token_start = 0;
  local_40c0.parser_state = ps_top;
  local_40c0.stack.
  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40c0.stack.
  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40c0.stack.
  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40c0.dict_key._M_dataplus._M_p = (pointer)&local_40c0.dict_key.field_2;
  local_40c0.dict_key._M_string_length = 0;
  local_40c0.dict_key.field_2._M_local_buf[0] = '\0';
  local_40c0.dict_key_offset = 0;
  local_40c0.is = is;
  local_40c0.reactor = reactor;
  anon_unknown.dwarf_40834::JSONParser::parse((JSONParser *)this);
  anon_unknown.dwarf_40834::JSONParser::~JSONParser(&local_40c0);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSONParser(InputSource& is, JSON::Reactor* reactor) :
            is(is),
            reactor(reactor),
            p(buf)
        {
        }